

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

bool __thiscall
Hospital::Password_Validate
          (Hospital *this,string *password,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  bool bVar1;
  ostream *poVar2;
  string *this_00;
  Hospital *this_01;
  undefined1 local_b0 [48];
  vector<Nurse,_std::allocator<Nurse>_> local_80;
  string local_68;
  string password_1;
  
  std::__cxx11::string::string((string *)&local_68,(string *)password);
  std::vector<Nurse,_std::allocator<Nurse>_>::vector(&local_80,All_Of_Nurses);
  std::vector<Doctor,_std::allocator<Doctor>_>::vector
            ((vector<Doctor,_std::allocator<Doctor>_> *)(local_b0 + 0x18),All_Of_Doctors);
  this_01 = (Hospital *)local_b0;
  std::vector<Patient,_std::allocator<Patient>_>::vector
            ((vector<Patient,_std::allocator<Patient>_> *)this_01,All_Of_Patients);
  bVar1 = Existence_Of_Password
                    (this_01,&local_68,&local_80,
                     (vector<Doctor,_std::allocator<Doctor>_> *)(local_b0 + 0x18),
                     (vector<Patient,_std::allocator<Patient>_> *)local_b0);
  std::vector<Patient,_std::allocator<Patient>_>::~vector
            ((vector<Patient,_std::allocator<Patient>_> *)local_b0);
  std::vector<Doctor,_std::allocator<Doctor>_>::~vector
            ((vector<Doctor,_std::allocator<Doctor>_> *)(local_b0 + 0x18));
  std::vector<Nurse,_std::allocator<Nurse>_>::~vector(&local_80);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"This password already exists !!!");
    std::endl<char,std::char_traits<char>>(poVar2);
    return false;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string(this_00,(string *)password);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

bool Hospital :: Password_Validate(string password , vector<Nurse> All_Of_Nurses , vector<Doctor> All_Of_Doctors , vector<Patient>All_Of_Patients) {
    try {
        if (Existence_Of_Password (password,All_Of_Nurses , All_Of_Doctors ,All_Of_Patients )) {
            cout << "This password already exists !!!"<<endl;   ///add bool func to search in file and check existence of user_name
            return false;
        }
        else throw password;
    }
    catch(string password) {
        cout << "your password  entered successfully ."<<endl;
        return true;
    }
}